

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O0

void __thiscall FSoftwareRenderer::ErrorCleanup(FSoftwareRenderer *this)

{
  FSoftwareRenderer *this_local;
  
  swrenderer::fakeActive = 0;
  swrenderer::fake3D = 0;
  while (swrenderer::CurrentSkybox != 0) {
    swrenderer::R_3D_DeleteHeights();
    swrenderer::R_3D_LeaveSkybox();
  }
  swrenderer::R_3D_ResetClip();
  swrenderer::R_3D_DeleteHeights();
  return;
}

Assistant:

void FSoftwareRenderer::ErrorCleanup ()
{
	fakeActive = 0;
	fake3D = 0;
	while (CurrentSkybox)
	{
		R_3D_DeleteHeights();
		R_3D_LeaveSkybox();
	}
	R_3D_ResetClip();
	R_3D_DeleteHeights();
}